

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpg4d_parser.c
# Opt level: O1

MPP_RET mpp_mpg4_parser_update_dpb(Mpg4dParser ctx)

{
  uint uVar1;
  RK_S32 RVar2;
  MppBufSlots slots;
  undefined8 in_RAX;
  long lVar3;
  undefined4 uVar4;
  
  uVar4 = (undefined4)((ulong)in_RAX >> 0x20);
  slots = *ctx;
  uVar1 = *(uint *)((long)ctx + 0x198);
  if (((byte)mpg4d_debug & 1) != 0) {
    _mpp_log_l(4,"mpg4d_parser","in\n","mpp_mpg4_parser_update_dpb");
  }
  lVar3 = *(long *)((long)ctx + 0x360) - *(long *)((long)ctx + 0x350);
  if (lVar3 != 0) {
    *(long *)((long)ctx + 0x358) = lVar3;
  }
  if ((uVar1 < 2) || (uVar1 == 3)) {
    RVar2 = *(RK_S32 *)((long)ctx + 0x278);
    if (-1 < RVar2 && *(int *)((long)ctx + 0x27c) == 0) {
      mpp_buf_slot_set_flag(slots,RVar2,SLOT_QUEUE_USE);
      mpp_buf_slot_enqueue(slots,RVar2,QUEUE_DISPLAY);
    }
    mpp_buf_slot_set_flag(slots,*(RK_S32 *)((long)ctx + 0x1c8),SLOT_CODEC_USE);
    if (-1 < *(RK_S32 *)((long)ctx + 0x328)) {
      mpp_buf_slot_clr_flag(slots,*(RK_S32 *)((long)ctx + 0x328),SLOT_CODEC_USE);
    }
    memcpy((void *)((long)ctx + 0x298),(void *)((long)ctx + 0x1e8),0xb0);
    memcpy((void *)((long)ctx + 0x1e8),(void *)((long)ctx + 0x138),0xb0);
    *(undefined8 *)((long)ctx + 0x1c0) = 0;
  }
  else if (uVar1 == 2) {
    if ((*(int *)((long)ctx + 0x278) < 0) || (*(int *)((long)ctx + 0x328) < 0)) {
      _mpp_log_l(2,"mpg4d_parser","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "(hdr_ref0->slot_idx >= 0) && (hdr_ref1->slot_idx >= 0)",
                 "mpp_mpg4_parser_update_dpb",CONCAT44(uVar4,0x5ea));
      if ((mpp_debug._3_1_ & 0x10) != 0) {
        abort();
      }
    }
    RVar2 = *(RK_S32 *)((long)ctx + 0x1c8);
    mpp_buf_slot_set_flag(slots,RVar2,SLOT_QUEUE_USE);
    mpp_buf_slot_enqueue(slots,RVar2,QUEUE_DISPLAY);
  }
  *(undefined8 *)((long)ctx + 0x198) = 0;
  *(undefined8 *)((long)ctx + 0x1a0) = 0;
  *(undefined8 *)((long)ctx + 0x1a8) = 0;
  *(undefined8 *)((long)ctx + 0x1b0) = 0;
  *(undefined8 *)((long)ctx + 0x1b8) = 0;
  *(undefined4 *)((long)ctx + 0x198) = 0xffffffff;
  *(undefined4 *)((long)ctx + 0x1c8) = 0xffffffff;
  *(undefined8 *)((long)ctx + 0x350) = *(undefined8 *)((long)ctx + 0x360);
  if (((byte)mpg4d_debug & 1) != 0) {
    _mpp_log_l(4,"mpg4d_parser","out\n","mpp_mpg4_parser_update_dpb");
  }
  return MPP_OK;
}

Assistant:

MPP_RET mpp_mpg4_parser_update_dpb(Mpg4dParser ctx)
{
    Mpg4dParserImpl *p = (Mpg4dParserImpl *)ctx;
    MppBufSlots slots = p->frame_slots;
    Mpg4Hdr *hdr_curr = &p->hdr_curr;
    Mpg4Hdr *hdr_ref0 = &p->hdr_ref0;
    Mpg4Hdr *hdr_ref1 = &p->hdr_ref1;
    RK_S32 coding_type = hdr_curr->vop.coding_type;
    RK_S32 index = p->output;

    mpg4d_dbg_func("in\n");

    // update pts increacement
    if (p->pts != p->last_pts)
        p->pts_inc = p->pts - p->last_pts;

    switch (coding_type) {
    case MPEG4_B_VOP : {
        mpp_assert((hdr_ref0->slot_idx >= 0) && (hdr_ref1->slot_idx >= 0));
        // B frame -> index current frame
        // output current frame and do not change ref0 and ref1
        index = hdr_curr->slot_idx;
        mpp_buf_slot_set_flag(slots, index, SLOT_QUEUE_USE);
        mpp_buf_slot_enqueue(slots, index, QUEUE_DISPLAY);
    }
    /*
     * NOTE: here fallback to N vop - do nothing
     */
    case MPEG4_INVALID_VOP :
    case MPEG4_N_VOP : {
    } break;
    case MPEG4_I_VOP :
    case MPEG4_P_VOP :
    case MPEG4_S_VOP :
        // the other case -> index reference 0
        index = hdr_ref0->slot_idx;
        if (!hdr_ref0->enqueued && index >= 0) {
            mpp_buf_slot_set_flag(slots, index, SLOT_QUEUE_USE);
            mpp_buf_slot_enqueue(slots, index, QUEUE_DISPLAY);
        }
        // non B frame send this frame to reference queue
        mpp_buf_slot_set_flag(slots, hdr_curr->slot_idx, SLOT_CODEC_USE);

        // release ref1
        index = hdr_ref1->slot_idx;
        if (index >= 0)
            mpp_buf_slot_clr_flag(slots, index, SLOT_CODEC_USE);

        // swap ref0 to ref1, current to ref0
        *hdr_ref1 = *hdr_ref0;
        *hdr_ref0 = *hdr_curr;
        hdr_curr->pts       = 0;
    }

    init_mpg4_hdr_vop(hdr_curr);
    hdr_curr->slot_idx = -1;
    p->last_pts = p->pts;

    mpg4d_dbg_func("out\n");

    return MPP_OK;
}